

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::to_chars(substr buf,const_raw_wrapper r)

{
  bool bVar1;
  error_flags eVar2;
  void *__dest;
  ulong in_RSI;
  void *in_RDI;
  void *in_stack_00000008;
  size_t sz;
  size_t in_stack_00000018;
  char *ptr;
  size_t space;
  void *vptr;
  size_t local_38;
  void *local_30;
  void *local_28;
  ulong local_20;
  ulong local_18;
  void **local_10;
  void **local_8;
  
  local_28 = in_RDI;
  local_20 = in_RSI;
  __dest = std::align(in_stack_00000018,sz,&local_30,&local_38);
  if (__dest == (void *)0x0) {
    local_18 = in_stack_00000018 + sz;
  }
  else {
    local_10 = &local_28;
    if (local_28 <= __dest) {
      local_8 = &local_28;
    }
    if (local_28 > __dest || (void *)((long)local_28 + local_20) < __dest) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x34dd90,(char *)0x42f8,"check failed: %s",
                   "ptr >= buf.begin() && ptr <= buf.end()");
    }
    local_18 = (long)__dest + (sz - (long)local_28);
    if (local_18 <= local_20) {
      memcpy(__dest,in_stack_00000008,sz);
    }
  }
  return local_18;
}

Assistant:

size_t to_chars(substr buf, fmt::const_raw_wrapper r)
{
    void * vptr = buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r.alignment, r.len, vptr, space);
    if(ptr == nullptr)
    {
        // if it was not possible to align, return a conservative estimate
        // of the required space
        return r.alignment + r.len;
    }
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    size_t sz = static_cast<size_t>(ptr - buf.str) + r.len;
    if(sz <= buf.len)
    {
        memcpy(ptr, r.buf, r.len);
    }
    return sz;
}